

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O3

void __thiscall Map::SpellGroup(Map *this,Character *from,unsigned_short spell_id)

{
  short sVar1;
  World *pWVar2;
  Character *this_00;
  bool bVar3;
  bool bVar4;
  int num;
  uint uVar5;
  ESF_Data *pEVar6;
  mapped_type *pmVar7;
  _Rb_tree_node_base *p_Var8;
  undefined6 in_register_00000012;
  list<Character_*,_std::allocator<Character_*>_> *__range2;
  int iVar9;
  pointer ppCVar10;
  uint uVar11;
  Character *this_01;
  _List_node_base *p_Var12;
  Character *character;
  set<Character_*,_std::less<Character_*>,_std::allocator<Character_*>_> in_range;
  PacketBuilder builder;
  undefined1 local_c8 [32];
  Character *local_a8;
  undefined1 local_a0 [32];
  _Rb_tree_node_base *local_80;
  size_t local_78;
  ESF_Data *local_70;
  pointer local_68;
  PacketBuilder local_60;
  
  uVar11 = (uint)CONCAT62(in_register_00000012,spell_id);
  pEVar6 = ESF::Get(from->world->esf,uVar11);
  if (pEVar6->id == 0) {
    return;
  }
  if (pEVar6->type != Heal) {
    return;
  }
  if (from->party == (Party *)0x0) {
    return;
  }
  if (from->tp < (int)pEVar6->tp) {
    return;
  }
  from->tp = from->tp - (int)pEVar6->tp;
  sVar1 = pEVar6->hp;
  iVar9 = (int)sVar1;
  local_a8 = from;
  if ((from->nointeract & 4U) == 0) goto LAB_00175487;
  if ((from->nointeract & 0x20U) == 0) {
    if (from->map->pk != false) goto LAB_00175487;
    pWVar2 = this->world;
    local_a0._0_8_ = local_a0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"GlobalPK","");
    pmVar7 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&pWVar2->config,(key_type *)local_a0);
    bVar3 = util::variant::GetBool(pmVar7);
    bVar4 = true;
    if (bVar3) {
      bVar4 = World::PKExcept(this->world,(int)this->id);
    }
    if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
      operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
    }
    if (bVar4 == false) goto LAB_00175487;
  }
  if (0 < sVar1) {
    iVar9 = 1;
  }
LAB_00175487:
  this_01 = local_a8;
  local_a0._24_8_ = local_a0 + 8;
  local_a0._8_4_ = _S_red;
  local_a0._16_8_ = 0;
  local_78 = 0;
  local_80 = (_Rb_tree_node_base *)local_a0._24_8_;
  PacketBuilder::PacketBuilder
            (&local_60,PACKET_SPELL,PACKET_TARGET_GROUP,
             ((long)(local_a8->party->members).
                    super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(local_a8->party->members).
                    super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * 10 + 8);
  local_70 = pEVar6;
  PacketBuilder::AddShort(&local_60,uVar11);
  num = Character::PlayerID(this_01);
  PacketBuilder::AddShort(&local_60,num);
  PacketBuilder::AddShort(&local_60,this_01->tp);
  PacketBuilder::AddShort(&local_60,iVar9);
  ppCVar10 = (this_01->party->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_68 = (this_01->party->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar10 != local_68) {
    do {
      this_00 = *ppCVar10;
      if (this_00->map == this_01->map) {
        uVar11 = (uint)local_70->hp;
        pWVar2 = this->world;
        local_c8._0_8_ = local_c8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"LimitDamage","");
        pmVar7 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&pWVar2->config,(key_type *)local_c8);
        bVar3 = util::variant::GetBool(pmVar7);
        if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
          operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
        }
        if ((bVar3) && (uVar5 = this_00->maxhp - this_00->hp, (int)uVar5 < (int)uVar11)) {
          uVar11 = uVar5;
        }
        uVar5 = 0;
        if (0 < (int)uVar11) {
          uVar5 = uVar11;
        }
        if ((local_a8->nointeract & 4U) != 0) {
          if ((local_a8->nointeract & 0x20U) == 0) {
            if (local_a8->map->pk == false) {
              pWVar2 = this->world;
              local_c8._0_8_ = local_c8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"GlobalPK","");
              pmVar7 = std::__detail::
                       _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&pWVar2->config,(key_type *)local_c8);
              bVar3 = util::variant::GetBool(pmVar7);
              bVar4 = true;
              if (bVar3) {
                bVar4 = World::PKExcept(this->world,(int)this->id);
              }
              if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
                operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
              }
              if (bVar4 != false) goto LAB_001756ad;
            }
          }
          else {
LAB_001756ad:
            uVar5 = (uint)(0 < (int)uVar11);
          }
        }
        this_00->hp = this_00->hp + uVar5;
        pWVar2 = this->world;
        local_c8._0_8_ = local_c8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"LimitDamage","");
        pmVar7 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&pWVar2->config,(key_type *)local_c8);
        this_01 = local_a8;
        bVar3 = util::variant::GetBool(pmVar7);
        if ((Character *)local_c8._0_8_ != (Character *)(local_c8 + 0x10)) {
          operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
        }
        if (!bVar3) {
          iVar9 = this_00->hp;
          if (this_00->maxhp < this_00->hp) {
            iVar9 = this_00->maxhp;
          }
          this_00->hp = iVar9;
        }
        PacketBuilder::AddByte(&local_60,0xff);
        PacketBuilder::AddByte(&local_60,0xff);
        PacketBuilder::AddByte(&local_60,0xff);
        PacketBuilder::AddByte(&local_60,0xff);
        PacketBuilder::AddByte(&local_60,0xff);
        iVar9 = Character::PlayerID(this_00);
        PacketBuilder::AddShort(&local_60,iVar9);
        iVar9 = (int)(((double)this_00->hp / (double)this_00->maxhp) * 100.0);
        if (iVar9 < 1) {
          iVar9 = 0;
        }
        if (99 < iVar9) {
          iVar9 = 100;
        }
        PacketBuilder::AddChar(&local_60,iVar9);
        PacketBuilder::AddShort(&local_60,this_00->hp);
        for (p_Var12 = (this->characters).
                       super__List_base<Character_*,_std::allocator<Character_*>_>._M_impl._M_node.
                       super__List_node_base._M_next;
            p_Var12 != (_List_node_base *)&this->characters; p_Var12 = p_Var12->_M_next) {
          local_c8._0_8_ = p_Var12[1]._M_next;
          bVar3 = Character::InRange(this_00,(Character *)local_c8._0_8_);
          if (bVar3) {
            std::
            _Rb_tree<Character*,Character*,std::_Identity<Character*>,std::less<Character*>,std::allocator<Character*>>
            ::_M_insert_unique<Character*const&>
                      ((_Rb_tree<Character*,Character*,std::_Identity<Character*>,std::less<Character*>,std::allocator<Character*>>
                        *)local_a0,(Character **)local_c8);
          }
        }
      }
      ppCVar10 = ppCVar10 + 1;
    } while (ppCVar10 != local_68);
  }
  if ((_Rb_tree_node_base *)local_a0._24_8_ != (_Rb_tree_node_base *)(local_a0 + 8)) {
    p_Var8 = (_Rb_tree_node_base *)local_a0._24_8_;
    do {
      Character::Send(*(Character **)(p_Var8 + 1),&local_60);
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    } while (p_Var8 != (_Rb_tree_node_base *)(local_a0 + 8));
  }
  PacketBuilder::~PacketBuilder(&local_60);
  std::
  _Rb_tree<Character_*,_Character_*,_std::_Identity<Character_*>,_std::less<Character_*>,_std::allocator<Character_*>_>
  ::~_Rb_tree((_Rb_tree<Character_*,_Character_*,_std::_Identity<Character_*>,_std::less<Character_*>,_std::allocator<Character_*>_>
               *)local_a0);
  return;
}

Assistant:

void Map::SpellGroup(Character *from, unsigned short spell_id)
{
	const ESF_Data& spell = from->world->esf->Get(spell_id);

	if (!spell || spell.type != ESF::Heal || !from->party || from->tp < spell.tp)
		return;

	from->tp -= spell.tp;

	int displayhp = spell.hp;

	if (!from->CanInteractCombat() && !(from->CanInteractPKCombat() && (from->map->pk || (this->world->config["GlobalPK"] && !this->world->PKExcept(this->id)))))
	{
		displayhp = std::min(displayhp, 1);
	}

	std::set<Character *> in_range;

	PacketBuilder builder(PACKET_SPELL, PACKET_TARGET_GROUP, 8 + from->party->members.size() * 10);
	builder.AddShort(spell_id);
	builder.AddShort(from->PlayerID());
	builder.AddShort(from->tp);
	builder.AddShort(displayhp);

	UTIL_FOREACH(from->party->members, member)
	{
		if (member->map != from->map)
			continue;

		int displayhp = spell.hp;
		int hpgain = spell.hp;

		if (this->world->config["LimitDamage"])
			hpgain = std::min(hpgain, member->maxhp - member->hp);

		hpgain = std::max(hpgain, 0);

		if (!from->CanInteractCombat() && !(from->CanInteractPKCombat() && (from->map->pk || (this->world->config["GlobalPK"] && !this->world->PKExcept(this->id)))))
			hpgain = std::min(hpgain, 1);

		member->hp += hpgain;

		if (!this->world->config["LimitDamage"])
			member->hp = std::min(member->hp, member->maxhp);

		// wat?
		builder.AddByte(255);
		builder.AddByte(255);
		builder.AddByte(255);
		builder.AddByte(255);
		builder.AddByte(255);

		builder.AddShort(member->PlayerID());
		builder.AddChar(util::clamp<int>(double(member->hp) / double(member->maxhp) * 100.0, 0, 100));
		builder.AddShort(member->hp);

		UTIL_FOREACH(this->characters, character)
		{
			if (member->InRange(character))
				in_range.insert(character);
		}
	}

	UTIL_FOREACH(in_range, character)
	{
		character->Send(builder);
	}
}